

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SampleShadingRenderingCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numSamples)

{
  long *plVar1;
  bool bVar2;
  ContextType ctxType;
  char *pcVar3;
  size_t sVar4;
  undefined4 in_register_00000014;
  long lVar5;
  ostringstream buf;
  long local_198 [14];
  ios_base local_128 [264];
  
  plVar1 = *(long **)(*(long *)((long)this + 0x70) + 8);
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(*plVar1 + 0x10))(plVar1,this,CONCAT44(in_register_00000014,numSamples))
  ;
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  pcVar3 = glu::getGLSLVersionDeclaration(bVar2 | GLSL_VERSION_310_ES);
  if (pcVar3 == (char *)0x0) {
    std::ios::clear((int)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar4 = strlen(pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "\nin highp vec4 v_position;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\thighp float field = dot(v_position.xy, v_position.xy) + dot(21.0 * v_position.xx, sin(3.1 * v_position.xy));\n\tfragColor = vec4(1.0, 1.0, 1.0, 1.0);\n\n\tif (fract(field) > 0.5)\n"
             ,0x10e);
  if (*(int *)((long)this + 0x128) == 1) {
    lVar5 = 0x28;
    pcVar3 = "\t\tfragColor = vec4(0.0, 0.0, 0.0, 1.0);\n";
  }
  else {
    if (*(int *)((long)this + 0x128) != 0) goto LAB_004044ed;
    lVar5 = 0xb;
    pcVar3 = "\t\tdiscard;\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,pcVar3,lVar5);
LAB_004044ed:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,"}",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string SampleShadingRenderingCase::genFragmentSource (int numSamples) const
{
	DE_UNREF(numSamples);
	const glu::GLSLVersion	version	= contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2))
									? glu::GLSL_VERSION_320_ES
									: glu::GLSL_VERSION_310_ES;
	std::ostringstream		buf;

	buf <<	glu::getGLSLVersionDeclaration(version) << "\n"
			"in highp vec4 v_position;\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	highp float field = dot(v_position.xy, v_position.xy) + dot(21.0 * v_position.xx, sin(3.1 * v_position.xy));\n"
			"	fragColor = vec4(1.0, 1.0, 1.0, 1.0);\n"
			"\n"
			"	if (fract(field) > 0.5)\n";

	if (m_type == TEST_DISCARD)
		buf <<	"		discard;\n";
	else if (m_type == TEST_COLOR)
		buf <<	"		fragColor = vec4(0.0, 0.0, 0.0, 1.0);\n";
	else
		DE_ASSERT(false);

	buf <<	"}";

	return buf.str();
}